

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::CheckZones(SFFile *this,int start,int stop,bool instr)

{
  ushort uVar1;
  SFGenList SVar2;
  SFGenList SVar3;
  uint local_44;
  int local_40;
  int j;
  int i;
  int zone_stop;
  int zone_start;
  SFGenerator terminal_gen;
  SFGenList *gens;
  SFBag *bag;
  bool instr_local;
  int stop_local;
  int start_local;
  SFFile *this_local;
  
  local_40 = start;
  if (instr) {
    gens = (SFGenList *)this->InstrBags;
    _zone_start = this->InstrGenerators;
    zone_stop._2_2_ = 0x35;
  }
  else {
    gens = (SFGenList *)this->PresetBags;
    _zone_start = this->PresetGenerators;
    zone_stop._2_2_ = 0x29;
  }
  do {
    if (stop <= local_40) {
      return;
    }
    local_44 = (uint)gens[(long)local_40 * 3].Oper;
    uVar1 = gens[(long)(local_40 + 1) * 3].Oper;
    if (uVar1 < local_44) {
      gens[(long)local_40 * 3].field_1.Range.Lo = 0xff;
      gens[(long)local_40 * 3].field_1.Range.Hi = 0xff;
      *(undefined1 *)&gens[(long)local_40 * 3 + 1].Oper = 0xff;
      *(undefined1 *)((long)&gens[(long)local_40 * 3 + 1].Oper + 1) = 0xff;
    }
    else {
      if ((local_40 != start) && ((int)gens[(long)start * 3 + 2] < 0)) {
        gens[(long)local_40 * 3].field_1 = gens[(long)start * 3].field_1;
        gens[(long)local_40 * 3 + 1].Oper = gens[(long)start * 3 + 1].Oper;
      }
      for (; (int)local_44 < (int)(uint)uVar1; local_44 = local_44 + 1) {
        if (_zone_start[(int)local_44].Oper == 0x2b) {
          gens[(long)local_40 * 3].field_1 = _zone_start[(int)local_44].field_1;
        }
        else if (_zone_start[(int)local_44].Oper == 0x2c) {
          *(anon_union_2_3_ea7ce7c6_for_SFGenList_1 *)(gens + (long)local_40 * 3 + 1) =
               _zone_start[(int)local_44].field_1;
        }
        else if (_zone_start[(int)local_44].Oper == zone_stop._2_2_) {
          if ((zone_stop._2_2_ == 0x29) &&
             ((int)(uint)_zone_start[(int)local_44].field_1.uAmount < this->NumInstruments + -1)) {
            SVar2.field_1.Amount = 0;
            SVar2.Oper = _zone_start[(int)local_44].field_1.uAmount;
            gens[(long)local_40 * 3 + 2] = SVar2;
          }
          else if ((zone_stop._2_2_ == 0x35) &&
                  ((int)(uint)_zone_start[(int)local_44].field_1.uAmount < this->NumSamples + -1)) {
            SVar3.field_1.Amount = 0;
            SVar3.Oper = _zone_start[(int)local_44].field_1.uAmount;
            gens[(long)local_40 * 3 + 2] = SVar3;
          }
          break;
        }
      }
      if (((int)gens[(long)local_40 * 3 + 2] < 0) && (local_40 != start)) {
        gens[(long)local_40 * 3].field_1.Range.Lo = 0xff;
        gens[(long)local_40 * 3].field_1.Range.Hi = 0xff;
        *(undefined1 *)&gens[(long)local_40 * 3 + 1].Oper = 0xff;
        *(undefined1 *)((long)&gens[(long)local_40 * 3 + 1].Oper + 1) = 0xff;
      }
      if (gens[(long)local_40 * 3].field_1.Range.Hi < gens[(long)local_40 * 3].field_1.Range.Lo) {
        swapvalues<unsigned_char>
                  ((uchar *)&gens[(long)local_40 * 3].field_1.uAmount,
                   &gens[(long)local_40 * 3].field_1.Range.Hi);
      }
      if (*(byte *)((long)&gens[(long)local_40 * 3 + 1].Oper + 1) <
          (byte)gens[(long)local_40 * 3 + 1].Oper) {
        swapvalues<unsigned_char>
                  ((uchar *)(gens + (long)local_40 * 3 + 1),
                   (uchar *)((long)&gens[(long)local_40 * 3 + 1].Oper + 1));
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void SFFile::CheckZones(int start, int stop, bool instr)
{
	SFBag *bag;
	SFGenList *gens;
	SFGenerator terminal_gen;
	int zone_start, zone_stop;
	int i, j;

	if (!instr)
	{
		bag = PresetBags;
		gens = PresetGenerators;
		terminal_gen = GEN_instrument;
	}
	else
	{
		bag = InstrBags;
		gens = InstrGenerators;
		terminal_gen = GEN_sampleID;
	}
	for (i = start; i < stop; ++i)
	{
		zone_start = bag[i].GenIndex;
		zone_stop = bag[i + 1].GenIndex;

		if (zone_start > zone_stop)
		{
			// Skip empty zones, and mark them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
			continue;
		}

		// According to the specs, if keyRange is present, it must be the first generator.
		// If velRange is present, it may only be preceded by keyRange. In real life, there
		// exist Soundfonts that violate this rule, so we need to scan every generator.

		// Preload ranges from the global zone.
		if (i != start && bag[start].Target < 0)
		{
			bag[i].KeyRange = bag[start].KeyRange;
			bag[i].VelRange = bag[start].VelRange;
		}
		for (j = zone_start; j < zone_stop; ++j)
		{
			if (gens[j].Oper == GEN_keyRange)
			{
				bag[i].KeyRange = gens[j].Range;
			}
			else if (gens[j].Oper == GEN_velRange)
			{
				bag[i].VelRange = gens[j].Range;
			}
			else if (gens[j].Oper == terminal_gen)
			{
				if (terminal_gen == GEN_instrument && gens[j].uAmount < NumInstruments - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				else if (terminal_gen == GEN_sampleID && gens[j].uAmount < NumSamples - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				break;
			}
		}
		if (bag[i].Target < 0 && i != start)
		{
			// Only the first zone may be targetless. If any other zones are,
			// make them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
		}

		// Check for swapped ranges. (Should we fix them or ignore them?)
		if (bag[i].KeyRange.Lo > bag[i].KeyRange.Hi)
		{
			swapvalues(bag[i].KeyRange.Lo, bag[i].KeyRange.Hi);
		}
		if (bag[i].VelRange.Lo > bag[i].VelRange.Hi)
		{
			swapvalues(bag[i].VelRange.Lo, bag[i].VelRange.Hi);
		}
	}
}